

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerSharedInputState.hpp
# Opt level: O2

void __thiscall antlr::LexerInputState::~LexerInputState(LexerInputState *this)

{
  ~LexerInputState(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~LexerInputState()
	{
		if (inputResponsible)
			delete input;
	}